

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O3

int unpackIfAllDigits(char *input)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  byte bVar7;
  uint uVar8;
  char *s;
  char *pcVar9;
  bool bVar10;
  
  bVar10 = (*input & 0xdfU) == 0x41;
  bVar5 = input[bVar10];
  if (bVar5 == 0) {
    return 0;
  }
  pcVar3 = input + bVar10;
  pcVar9 = (char *)0x0;
  do {
    if ((pcVar3[2] == '\0') || (pcVar3[2] == '-')) goto LAB_001cf4f4;
    if (bVar5 == 0x2d) {
      bVar5 = 0x2d;
      goto LAB_001cf4f4;
    }
    pcVar2 = pcVar3;
    if ((pcVar9 != (char *)0x0 || bVar5 != 0x2e) &&
       (pcVar2 = pcVar9, 9 < (byte)(&decodeChar_decode_chars)[bVar5])) {
      return 0;
    }
    bVar5 = pcVar3[1];
    pcVar3 = pcVar3 + 1;
    pcVar9 = pcVar2;
  } while (bVar5 != 0);
  bVar5 = 0;
LAB_001cf4f4:
  if (pcVar9 == (char *)0x0) {
    return 0;
  }
  if ((byte)(*input | 0x20U) == 0x61) {
    iVar1 = 0x3e0;
    if ((bVar5 | 0x20) != 0x61) {
      iVar1 = (int)(char)(&decodeChar_decode_chars)[bVar5] << 5;
    }
    iVar6 = 0x1f;
    if ((byte)(pcVar3[1] | 0x20U) != 0x61) {
      iVar6 = (int)(char)(&decodeChar_decode_chars)[(byte)pcVar3[1]];
    }
    iVar6 = iVar6 + iVar1;
    *input = ((char)(uint)((ulong)((long)iVar6 * 0x51eb851f) >> 0x25) - (char)(iVar6 >> 0x1f)) + '0'
    ;
    iVar1 = iVar6 / 10;
    *pcVar3 = (char)iVar1 +
              ((char)(uint)((ulong)((long)iVar1 * 0x66666667) >> 0x22) - (char)(iVar1 >> 0x1f)) *
              -10 + '0';
    pcVar3[1] = (char)iVar6 + (char)iVar1 * -10 + '0';
    return 1;
  }
  bVar7 = (bVar5 + 0xbf) * '@' | (byte)(bVar5 + 0xbf) >> 2;
  if (0xd < bVar7) {
    return 0;
  }
  if ((0x2323U >> (bVar7 & 0x1f) & 1) == 0) {
    return 0;
  }
  bVar5 = (bVar5 + 0xbb) * '\x10' | (byte)(bVar5 + 0xbb) >> 4;
  iVar1 = 0;
  if (bVar5 < 4) {
    iVar1 = *(int *)(&DAT_00256f10 + (ulong)bVar5 * 4);
  }
  bVar5 = pcVar3[1] + 0xbf;
  bVar5 = bVar5 * '@' | bVar5 >> 2;
  if (bVar5 < 0xe) {
    if ((0x101U >> (bVar5 & 0x1f) & 1) != 0) {
      uVar8 = iVar1 + 0x1f;
      goto LAB_001cf64f;
    }
    iVar6 = 0x20;
    if ((0x202U >> (bVar5 & 0x1f) & 1) == 0) {
      if ((0x2020U >> (bVar5 & 0x1f) & 1) == 0) goto LAB_001cf637;
      iVar6 = 0x21;
    }
  }
  else {
LAB_001cf637:
    iVar6 = (int)(char)(&decodeChar_decode_chars)[(byte)pcVar3[1]];
    if ((char)(&decodeChar_decode_chars)[(byte)pcVar3[1]] < '\0') {
      return -0x129;
    }
  }
  uVar8 = iVar1 + iVar6;
  if (99 < uVar8) {
    return -0x127;
  }
LAB_001cf64f:
  uVar4 = (uVar8 & 0xff) / 10;
  *pcVar3 = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[uVar4];
  pcVar3[1] = "0123456789BCDFGHJKLMNPQRSTVWXYZAEU"[(byte)((char)uVar8 + (char)uVar4 * -10)];
  return 1;
}

Assistant:

static int unpackIfAllDigits(char *input) {
    char *s = input;
    char *dotpos = NULL;
    const int aonly = ((*s == 'A') || (*s == 'a'));
    if (aonly) {
        s++;
    } // v1.50
    for (; *s != 0 && s[2] != 0 && s[2] != '-'; s++) {
        if (*s == '-') {
            break;
        } else if (*s == '.' && !dotpos) {
            dotpos = s;
        } else if ((decodeChar(*s) < 0) || (decodeChar(*s) > 9)) {
            return 0;
        }  // nondigit, so stop
    }

    if (dotpos) {
        if (aonly) // v1.50 encoded only with A's
        {
            const int v = (((s[0] == 'A') || (s[0] == 'a')) ? 31 : decodeChar(s[0])) * 32 +
                          (((s[1] == 'A') || (s[1] == 'a')) ? 31 : decodeChar(s[1]));
            *input = (char) ('0' + (v / 100));
            s[0] = (char) ('0' + ((v / 10) % 10));
            s[1] = (char) ('0' + (v % 10));
            return 1;
        } // v1.50

        if ((*s == 'a') || (*s == 'e') || (*s == 'u') ||
            (*s == 'A') || (*s == 'E') || (*s == 'U')) {
            char *e = s + 1;  // s is vowel, e is lastchar

            int v = 0;
            if (*s == 'e' || *s == 'E') {
                v = 34;
            } else if (*s == 'u' || *s == 'U') {
                v = 68;
            }

            if ((*e == 'a') || (*e == 'A')) {
                v += 31;
            } else if ((*e == 'e') || (*e == 'E')) {
                v += 32;
            } else if ((*e == 'u') || (*e == 'U')) {
                v += 33;
            } else if (decodeChar(*e) < 0) {
                return (int) ERR_INVALID_CHARACTER;
            } else {
                v += decodeChar(*e);
            }

            if (v < 100) {
                *s = ENCODE_CHARS[(unsigned int) v / 10];
                *e = ENCODE_CHARS[(unsigned int) v % 10];
            } else {
                return (int) ERR_INVALID_ENDVOWELS; // mapcodes ends in UE or UU
            }
            return 1;
        }
    }
    return 0; // no vowel just before end
}